

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
ModbusSimulationDataGenerator::SendGenericResponse
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U8 FuncCode,U8 ByteCount,U8 *Status)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  char cVar4;
  U64 value;
  uint uVar5;
  ModbusSimulationDataGenerator *pMVar6;
  ModbusSimulationDataGenerator *this_00;
  int i;
  ulong uVar7;
  
  if (this->mSettings->mModbusMode == ModbusRTUServer) {
    CreateModbusByte(this,(ulong)DeviceID);
    uVar5 = (int)this + 0x30;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)FuncCode);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    uVar3 = (ulong)ByteCount;
    CreateModbusByte(this,uVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      CreateModbusByte(this,(ulong)Status[uVar7]);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptor::Advance(uVar5);
    }
    uVar2 = this->crc_tab16[(byte)~((byte)this->crc_tab16[(byte)~DeviceID] ^ FuncCode)] >> 8 ^
            this->crc_tab16
            [(byte)((byte)(this->crc_tab16[(byte)~DeviceID] >> 8) ^
                    (byte)this->crc_tab16
                          [(byte)~((byte)this->crc_tab16[(byte)~DeviceID] ^ FuncCode)] ^ ByteCount)]
    ;
    uVar7 = 0;
    while( true ) {
      if (uVar3 == uVar7) break;
      uVar2 = uVar2 >> 8 ^ this->crc_tab16[(byte)((byte)uVar2 ^ Status[uVar7])];
      uVar7 = uVar7 + 1;
    }
    CreateModbusByte(this,(ulong)(uVar2 & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    value = (U64)(uVar2 >> 8);
  }
  else {
    cVar4 = FuncCode + DeviceID + ByteCount;
    for (uVar3 = 0; ByteCount != uVar3; uVar3 = uVar3 + 1) {
      cVar4 = cVar4 + Status[uVar3];
    }
    CreateModbusByte(this,0x3a);
    this_00 = (ModbusSimulationDataGenerator *)&this->mModbusSimulationData;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    uVar5 = (uint)this_00;
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,DeviceID >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,DeviceID & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,FuncCode >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,FuncCode & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,ByteCount >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,ByteCount & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    for (uVar3 = 0; ByteCount != uVar3; uVar3 = uVar3 + 1) {
      bVar1 = BinToLATIN1(pMVar6,Status[uVar3] >> 4);
      CreateModbusByte(this,(ulong)bVar1);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      pMVar6 = this_00;
      SimulationChannelDescriptor::Advance(uVar5);
      bVar1 = BinToLATIN1(pMVar6,Status[uVar3] & 0xf);
      CreateModbusByte(this,(ulong)bVar1);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      pMVar6 = this_00;
      SimulationChannelDescriptor::Advance(uVar5);
    }
    bVar1 = BinToLATIN1(pMVar6,(byte)-cVar4 >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(this_00,-cVar4 & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    value = 10;
  }
  CreateModbusByte(this,value);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance((int)this + 0x30);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendGenericResponse( U8 DeviceID, U8 FuncCode, U8 ByteCount, U8 Status[] )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUServer )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( FuncCode );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ByteCount );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        for( int i = 0; i < ByteCount; i++ )
        {
            CreateModbusByte( Status[ i ] );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
        }

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, FuncCode );
        CRCValue = update_CRC( CRCValue, ByteCount );

        for( int i = 0; i < ByteCount; i++ )
        {
            CRCValue = update_CRC( CRCValue, Status[ i ] );
        }

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + FuncCode;
        LRCvalue = LRCvalue + ( ByteCount );

        for( int i = 0; i < ByteCount; i++ )
        {
            LRCvalue = LRCvalue + ( Status[ i ] );
        }

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( FuncCode >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( FuncCode & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ByteCount >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ByteCount & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        for( int i = 0; i < ByteCount; i++ )
        {
            CreateModbusByte( BinToLATIN1( Status[ i ] >> 4 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

            CreateModbusByte( BinToLATIN1( Status[ i ] & 0xF ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        }

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}